

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int ddCheckPermuation(DdManager *table,MtrNode *treenode,int *perm,int *invperm)

{
  uint uVar1;
  int iVar2;
  int *invperm_00;
  uint uVar3;
  long lVar4;
  
  if (treenode != (MtrNode *)0x0) {
    invperm_00 = (int *)(ulong)(uint)table->size;
    uVar3 = 0;
    for (lVar4 = (long)(int)treenode->low; (uint)lVar4 < treenode->size + treenode->low;
        lVar4 = lVar4 + 1) {
      uVar1 = perm[table->invperm[lVar4]];
      if ((int)uVar1 < (int)invperm_00) {
        invperm_00 = (int *)(ulong)uVar1;
      }
      if ((int)uVar3 < (int)uVar1) {
        uVar3 = uVar1;
      }
    }
    if ((uVar3 - (int)invperm_00) + 1 != treenode->size) {
      return 0;
    }
    if ((treenode->child != (MtrNode *)0x0) &&
       (iVar2 = ddCheckPermuation(table,treenode->child,perm,invperm_00), iVar2 == 0)) {
      return 0;
    }
    if ((treenode->younger != (MtrNode *)0x0) &&
       (iVar2 = ddCheckPermuation(table,treenode->younger,perm,invperm_00), iVar2 == 0)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int
ddCheckPermuation(
  DdManager * table,
  MtrNode * treenode,
  int * perm,
  int * invperm)
{
    int i, size;
    int index, level, minLevel, maxLevel;

    if (treenode == NULL) return(1);

    minLevel = table->size;
    maxLevel = 0;
    /* i : level */
    for (i = treenode->low; i < treenode->low + treenode->size; i++) {
        index = table->invperm[i];
        level = perm[index];
        if (level < minLevel)
            minLevel = level;
        if (level > maxLevel)
            maxLevel = level;
    }
    size = maxLevel - minLevel + 1;
    if (size != treenode->size)
        return(0);

    if (treenode->child != NULL) {
        if (!ddCheckPermuation(table, treenode->child, perm, invperm))
            return(0);
    }
    if (treenode->younger != NULL) {
        if (!ddCheckPermuation(table, treenode->younger, perm, invperm))
            return(0);
    }
    return(1);
}